

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::add_sample
          (TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this,double t,
          vector<int,_std::allocator<int>_> *v)

{
  undefined1 local_48 [8];
  Sample s;
  vector<int,_std::allocator<int>_> *v_local;
  double t_local;
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this_local;
  
  s._32_8_ = v;
  Sample::Sample((Sample *)local_48);
  local_48 = (undefined1  [8])t;
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)&s,(vector<int,_std::allocator<int>_> *)s._32_8_);
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample>>
              *)this,(Sample *)local_48);
  this->_dirty = true;
  Sample::~Sample((Sample *)local_48);
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }